

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ExpressionStatementSyntax::setChild
          (ExpressionStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c90388 + *(int *)(&DAT_00c90388 + in_RSI * 4)))();
  return;
}

Assistant:

void ExpressionStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}